

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  Select *pSVar5;
  uchar *puVar6;
  uchar *puVar7;
  sqlite3 *psVar8;
  sqlite3_context *in_RDI;
  ExprList *pUpsertSet;
  Table *pTarget;
  TriggerStep *pStep;
  FKey *pFKey;
  int bFKOnly;
  Select *pSelect;
  sqlite3_xauth xAuth;
  Table *pTab;
  int i;
  Index *pIdx;
  Walker sWalker;
  Parse sParse;
  int rc;
  char *zOld;
  int bTemp;
  int bQuote;
  char *zNew;
  int iCol;
  char *zTable;
  char *zDb;
  char *zSql;
  RenameCtx sCtx;
  sqlite3 *db;
  Select *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  uint uVar9;
  Trigger *in_stack_fffffffffffffd68;
  sqlite3 *in_stack_fffffffffffffd70;
  sqlite3 *in_stack_fffffffffffffd78;
  Parse *in_stack_fffffffffffffd80;
  FKey *pFVar10;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  Parse *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  Vdbe *pVVar11;
  char *zSql_00;
  code *pRename;
  code *pCtx;
  char local_218 [8];
  char *local_210;
  int local_200;
  char *in_stack_fffffffffffffe58;
  Parse *in_stack_fffffffffffffe60;
  sqlite3 *local_170;
  sqlite3 *local_e0;
  Index *local_d8;
  Trigger *local_d0;
  int local_7c;
  RenameCtx local_40;
  sqlite3 *local_20;
  
  local_20 = sqlite3_context_db_handle(in_RDI);
  puVar4 = sqlite3_value_text((sqlite3_value *)0x1ddd33);
  pSVar5 = (Select *)sqlite3_value_text((sqlite3_value *)0x1ddd4c);
  puVar6 = sqlite3_value_text((sqlite3_value *)0x1ddd65);
  uVar2 = sqlite3_value_int((sqlite3_value *)0x1ddd7e);
  puVar7 = sqlite3_value_text((sqlite3_value *)0x1ddd96);
  sqlite3_value_int((sqlite3_value *)0x1dddaf);
  iVar3 = sqlite3_value_int((sqlite3_value *)0x1dddc7);
  p_Var1 = local_20->xAuth;
  if (puVar4 == (uchar *)0x0) {
    return;
  }
  if (puVar6 == (uchar *)0x0) {
    return;
  }
  if (puVar7 == (uchar *)0x0) {
    return;
  }
  if ((int)uVar2 < 0) {
    return;
  }
  sqlite3BtreeEnterAll((sqlite3 *)0x1dde2e);
  psVar8 = (sqlite3 *)
           sqlite3FindTable(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                            (char *)in_stack_fffffffffffffd68);
  if ((psVar8 == (sqlite3 *)0x0) || ((int)*(i16 *)((long)&psVar8->szMmap + 6) <= (int)uVar2)) {
    sqlite3BtreeLeaveAll((sqlite3 *)0x1dde79);
    return;
  }
  memset(&local_40,0,0x20);
  uVar9 = uVar2;
  if (uVar2 == (int)*(i16 *)((long)&psVar8->szMmap + 4)) {
    uVar9 = 0xffffffff;
  }
  local_20->xAuth = (sqlite3_xauth)0x0;
  local_40.iCol = uVar9;
  local_7c = renameParseSql(in_stack_fffffffffffffd90,
                            (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                            (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  memset(&stack0xfffffffffffffdb8,0,0x30);
  zSql_00 = local_218;
  pRename = renameColumnExprCb;
  pCtx = renameColumnSelectCb;
  local_40.pTab = (Table *)psVar8;
  if (local_7c == 0) {
    if (local_e0 == (sqlite3 *)0x0) {
      if (local_d8 == (Index *)0x0) {
        in_stack_fffffffffffffd58 = pSVar5;
        if (iVar3 != 0) {
          in_stack_fffffffffffffd58 = (Select *)0x0;
        }
        local_7c = renameResolveTrigger(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        if (local_7c != 0) goto LAB_001de467;
        for (in_stack_fffffffffffffd78 = (sqlite3 *)local_d0->step_list;
            in_stack_fffffffffffffd78 != (sqlite3 *)0x0;
            in_stack_fffffffffffffd78 = *(sqlite3 **)&in_stack_fffffffffffffd78->nSchemaLock) {
          if ((in_stack_fffffffffffffd78->mutex != (sqlite3_mutex *)0x0) &&
             (in_stack_fffffffffffffd70 =
                   (sqlite3 *)
                   sqlite3LocateTable((Parse *)CONCAT44(in_stack_fffffffffffffd8c,
                                                        in_stack_fffffffffffffd88),
                                      (u32)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                                      (char *)in_stack_fffffffffffffd78,
                                      (char *)in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd70 == psVar8)) {
            if (in_stack_fffffffffffffd78->lastRowid != 0) {
              in_stack_fffffffffffffd68 = *(Trigger **)(in_stack_fffffffffffffd78->lastRowid + 0x10)
              ;
              renameColumnElistNames
                        (in_stack_fffffffffffffd80,(RenameCtx *)in_stack_fffffffffffffd78,
                         (ExprList *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
            }
            renameColumnIdlistNames
                      (in_stack_fffffffffffffd80,(RenameCtx *)in_stack_fffffffffffffd78,
                       (IdList *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
            renameColumnElistNames
                      (in_stack_fffffffffffffd80,(RenameCtx *)in_stack_fffffffffffffd78,
                       (ExprList *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
          }
        }
        if (local_170 == psVar8) {
          renameColumnIdlistNames
                    (in_stack_fffffffffffffd80,(RenameCtx *)0x0,(IdList *)in_stack_fffffffffffffd70,
                     (char *)in_stack_fffffffffffffd68);
        }
        renameWalkTrigger((Walker *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      else {
        sqlite3WalkExprList((Walker *)in_stack_fffffffffffffd68,
                            (ExprList *)CONCAT44(uVar9,in_stack_fffffffffffffd60));
        sqlite3WalkExpr((Walker *)CONCAT44(uVar9,in_stack_fffffffffffffd60),
                        (Expr *)in_stack_fffffffffffffd58);
      }
    }
    else {
      in_stack_fffffffffffffd90 = (Parse *)local_e0->mutex;
      if (in_stack_fffffffffffffd90 == (Parse *)0x0) {
        in_stack_fffffffffffffd8c =
             sqlite3_stricmp((char *)in_stack_fffffffffffffd58,(char *)0x1de060);
        local_40.pTab = (Table *)local_e0;
        if (in_stack_fffffffffffffd8c == 0) {
          renameTokenFind((Parse *)local_218,&local_40,(&local_e0->pVdbe->db)[(long)(int)uVar2 * 4])
          ;
          if (local_40.iCol < 0) {
            renameTokenFind((Parse *)local_218,&local_40,(i16 *)((long)&local_e0->szMmap + 4));
          }
          sqlite3WalkExprList((Walker *)in_stack_fffffffffffffd68,
                              (ExprList *)CONCAT44(uVar9,in_stack_fffffffffffffd60));
          for (pVVar11 = (Vdbe *)local_e0->pDfltColl; pVVar11 != (Vdbe *)0x0;
              pVVar11 = *(Vdbe **)&pVVar11->nMem) {
            sqlite3WalkExprList((Walker *)in_stack_fffffffffffffd68,
                                (ExprList *)CONCAT44(uVar9,in_stack_fffffffffffffd60));
          }
          in_stack_fffffffffffffdb0 = (char *)0x0;
        }
        for (pFVar10 = (FKey *)local_e0->aDb; pFVar10 != (FKey *)0x0; pFVar10 = pFVar10->pNextFrom)
        {
          for (in_stack_fffffffffffffdac = 0; in_stack_fffffffffffffdac < pFVar10->nCol;
              in_stack_fffffffffffffdac = in_stack_fffffffffffffdac + 1) {
            if ((in_stack_fffffffffffffd8c == 0) &&
               (pFVar10->aCol[in_stack_fffffffffffffdac].iFrom == uVar2)) {
              renameTokenFind((Parse *)local_218,&local_40,pFVar10->aCol + in_stack_fffffffffffffdac
                             );
            }
            iVar3 = sqlite3_stricmp((char *)in_stack_fffffffffffffd58,(char *)0x1de1cf);
            if ((iVar3 == 0) &&
               (iVar3 = sqlite3_stricmp((char *)in_stack_fffffffffffffd58,(char *)0x1de1fd),
               iVar3 == 0)) {
              renameTokenFind((Parse *)local_218,&local_40,
                              pFVar10->aCol[in_stack_fffffffffffffdac].zCol);
            }
          }
        }
        in_stack_fffffffffffffd80 = (Parse *)0x0;
      }
      else {
        local_200 = 0;
        sqlite3SelectPrep((Parse *)CONCAT44(uVar9,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,(NameContext *)0x1ddfe9);
        in_stack_fffffffffffffd60 = local_200;
        if (local_20->mallocFailed != '\0') {
          in_stack_fffffffffffffd60 = 7;
        }
        local_7c = in_stack_fffffffffffffd60;
        if (in_stack_fffffffffffffd60 != 0) goto LAB_001de467;
        sqlite3WalkSelect((Walker *)in_stack_fffffffffffffd68,(Select *)((ulong)uVar9 << 0x20));
      }
    }
    local_7c = renameEditSql((sqlite3_context *)pCtx,(RenameCtx *)pRename,zSql_00,
                             in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  }
LAB_001de467:
  if (local_7c != 0) {
    if (local_210 == (char *)0x0) {
      sqlite3_result_error_code
                ((sqlite3_context *)CONCAT44(uVar9,in_stack_fffffffffffffd60),
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    }
    else {
      renameColumnParseError
                ((sqlite3_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                 (sqlite3_value *)in_stack_fffffffffffffd80,
                 (sqlite3_value *)in_stack_fffffffffffffd78,(Parse *)in_stack_fffffffffffffd70);
    }
  }
  renameParseCleanup((Parse *)CONCAT44(uVar9,in_stack_fffffffffffffd60));
  renameTokenFree(in_stack_fffffffffffffd70,(RenameToken *)in_stack_fffffffffffffd68);
  local_20->xAuth = p_Var1;
  sqlite3BtreeLeaveAll((sqlite3 *)0x1de506);
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}